

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v7::detail::
     handle_cstring_type_spec<char,fmt::v7::detail::arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::error_handler>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
  *paVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  size_t in_RCX;
  void *in_RDX;
  int iVar3;
  undefined7 in_register_00000039;
  
  iVar3 = (int)(error_handler *)CONCAT71(in_register_00000039,spec);
  if (iVar3 != 0x73) {
    if (iVar3 == 0x70) {
      paVar1 = handler->formatter;
      bVar2 = write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
                        ((paVar1->out_).container,(unsigned_long)handler->value,paVar1->specs_);
      (paVar1->out_).container = bVar2.container;
      return;
    }
    if (iVar3 != 0) {
      error_handler::on_error
                ((error_handler *)CONCAT71(in_register_00000039,spec),"invalid type specifier");
    }
  }
  arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
  ::write(handler->formatter,(int)handler->value,in_RDX,in_RCX);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler&& handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}